

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O1

void internal_refresh(EPSG *psg)

{
  uint uVar1;
  
  uVar1 = psg->clk >> (psg->chp_flags >> 4 & 1);
  if (psg->quality != 0) {
    psg->base_incr = 0x1000000;
    psg->realstep = (uint32_t)(0x80000000 / (ulong)psg->rate);
    psg->psgstep = (uint32_t)(0x80000000 / (ulong)(uVar1 >> 3));
    psg->psgtime = 0;
    return;
  }
  psg->base_incr = (uint32_t)(long)(((double)uVar1 * 16777216.0) / ((double)psg->rate * 8.0));
  return;
}

Assistant:

static void
internal_refresh (EPSG * psg)
{
  uint32_t clk = psg->clk;
  
  if (psg->chp_flags & YM2149_PIN26_LOW)
    clk /= 2;
  
  if (psg->quality)
  {
    psg->base_incr = 1 << GETA_BITS;
    psg->realstep = (uint32_t) ((1 << 31) / psg->rate);
    psg->psgstep = (uint32_t) ((1 << 31) / (clk / 8));
    psg->psgtime = 0;
  }
  else
  {
    psg->base_incr =
      (uint32_t) ((double) clk * (1 << GETA_BITS) / (8.0 * psg->rate));
  }
}